

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O0

int ecjpake_kkpp_read(mbedtls_md_type_t md_type,mbedtls_ecp_group *grp,int pf,mbedtls_ecp_point *G,
                     mbedtls_ecp_point *Xa,mbedtls_ecp_point *Xb,char *id,uchar *buf,size_t len)

{
  uchar *end_00;
  uchar *end;
  uchar *p;
  mbedtls_ecp_point *pmStack_38;
  int ret;
  mbedtls_ecp_point *Xb_local;
  mbedtls_ecp_point *Xa_local;
  mbedtls_ecp_point *G_local;
  mbedtls_ecp_group *pmStack_18;
  int pf_local;
  mbedtls_ecp_group *grp_local;
  mbedtls_md_type_t md_type_local;
  
  p._4_4_ = 0xffffff92;
  end = buf;
  end_00 = buf + len;
  pmStack_38 = Xb;
  Xb_local = Xa;
  Xa_local = G;
  G_local._4_4_ = pf;
  pmStack_18 = grp;
  grp_local._4_4_ = md_type;
  p._4_4_ = ecjpake_kkp_read(md_type,grp,pf,G,Xa,id,&end,end_00);
  if (((p._4_4_ == 0) &&
      (p._4_4_ = ecjpake_kkp_read(grp_local._4_4_,pmStack_18,G_local._4_4_,Xa_local,pmStack_38,id,
                                  &end,end_00), p._4_4_ == 0)) && (end != end_00)) {
    p._4_4_ = -0x4f80;
  }
  return p._4_4_;
}

Assistant:

static int ecjpake_kkpp_read(const mbedtls_md_type_t md_type,
                             const mbedtls_ecp_group *grp,
                             const int pf,
                             const mbedtls_ecp_point *G,
                             mbedtls_ecp_point *Xa,
                             mbedtls_ecp_point *Xb,
                             const char *id,
                             const unsigned char *buf,
                             size_t len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const unsigned char *p = buf;
    const unsigned char *end = buf + len;

    /*
     * struct {
     *     ECJPAKEKeyKP ecjpake_key_kp_pair_list[2];
     * } ECJPAKEKeyKPPairList;
     */
    MBEDTLS_MPI_CHK(ecjpake_kkp_read(md_type, grp, pf, G, Xa, id, &p, end));
    MBEDTLS_MPI_CHK(ecjpake_kkp_read(md_type, grp, pf, G, Xb, id, &p, end));

    if (p != end) {
        ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

cleanup:
    return ret;
}